

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Resize
          (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int64_t newsize,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *object)

{
  string *psVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ostream *this_00;
  ulong uVar4;
  ulong *puVar5;
  string *this_01;
  string *in_RDX;
  ulong in_RSI;
  long in_RDI;
  ulong uVar6;
  int64_t i;
  int64_t large;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *newstore;
  ulong local_68;
  string *local_50;
  long local_30;
  string *local_20;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      local_20 = (string *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_RSI;
      uVar4 = SUB168(auVar3 * ZEXT816(0x20),0);
      uVar6 = uVar4 + 8;
      if (SUB168(auVar3 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar4) {
        uVar6 = 0xffffffffffffffff;
      }
      puVar5 = (ulong *)operator_new__(uVar6);
      *puVar5 = in_RSI;
      local_20 = (string *)(puVar5 + 1);
      if (in_RSI != 0) {
        local_50 = local_20;
        do {
          std::__cxx11::string::string(local_50);
          local_50 = local_50 + 0x20;
        } while (local_50 != local_20 + in_RSI * 0x20);
      }
    }
    local_68 = in_RSI;
    if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
      local_68 = *(ulong *)(in_RDI + 0x10);
    }
    for (local_30 = 0; local_30 < (long)local_68; local_30 = local_30 + 1) {
      std::__cxx11::string::operator=
                (local_20 + local_30 * 0x20,(string *)(*(long *)(in_RDI + 8) + local_30 * 0x20));
    }
    for (; local_30 < (long)in_RSI; local_30 = local_30 + 1) {
      std::__cxx11::string::operator=(local_20 + local_30 * 0x20,in_RDX);
    }
    if (*(long *)(in_RDI + 8) != 0) {
      psVar1 = *(string **)(in_RDI + 8);
      if (psVar1 != (string *)0x0) {
        lVar2 = *(long *)(psVar1 + -8);
        this_01 = psVar1 + lVar2 * 0x20;
        while (psVar1 != this_01) {
          this_01 = this_01 + -0x20;
          std::__cxx11::string::~string(this_01);
        }
        operator_delete__(psVar1 + -8,lVar2 * 0x20 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    *(string **)(in_RDI + 8) = local_20;
    *(ulong *)(in_RDI + 0x10) = in_RSI;
    *(ulong *)(in_RDI + 0x18) = in_RSI;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}